

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateDocCommentBodyForLocation
               (Printer *printer,SourceLocation *location,bool trailingNewline,int indentCount)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  string indent;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string comments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  allocator *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 skip_empty;
  char *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  byte local_c9;
  string *in_stack_ffffffffffffff38;
  string *this;
  Printer *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  Printer *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Printer *in_stack_ffffffffffffff70;
  int local_84;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_58 [32];
  string local_38 [32];
  int local_18;
  byte local_11;
  long local_10;
  
  skip_empty = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10 + 0x10);
  }
  else {
    args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10 + 0x30);
  }
  std::__cxx11::string::string(local_38,(string *)args_3);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    EscapePhpdoc(in_stack_ffffffffffffff38);
    this = local_58;
    std::__cxx11::string::operator=(local_38,this);
    std::__cxx11::string::~string(this);
    Split(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(bool)skip_empty);
    while( true ) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff10);
      local_c9 = 0;
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back(in_stack_ffffffffffffff00);
        local_c9 = std::__cxx11::string::empty();
      }
      if ((local_c9 & 1) == 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4ab3f7);
    }
    local_84 = 0;
    while( true ) {
      uVar2 = (ulong)local_84;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_80);
      if (sVar3 <= uVar2) break;
      if (local_18 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_80,(long)local_84);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) goto LAB_004ab50d;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_80,(long)local_84);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
        if (*pcVar5 != '/') goto LAB_004ab50d;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_80,(long)local_84);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   &in_stack_ffffffffffffff50->variable_delimiter_,args_3);
      }
      else {
LAB_004ab50d:
        uVar2 = (ulong)local_18;
        in_stack_ffffffffffffff10 = (allocator *)&stack0xffffffffffffff57;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff58,uVar2,' ',in_stack_ffffffffffffff10);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_80,(long)local_84);
        io::Printer::Print<char[4],std::__cxx11::string,char[5],std::__cxx11::string>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   &in_stack_ffffffffffffff60->variable_delimiter_,in_stack_ffffffffffffff58,
                   &in_stack_ffffffffffffff50->variable_delimiter_,args_3);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
      }
      local_84 = local_84 + 1;
    }
    if ((local_11 & 1) != 0) {
      io::Printer::Print<>(in_stack_ffffffffffffff50,(char *)args_3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff10);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void GenerateDocCommentBodyForLocation(
    io::Printer* printer, const SourceLocation& location, bool trailingNewline,
    int indentCount) {
  string comments = location.leading_comments.empty() ?
      location.trailing_comments : location.leading_comments;
  if (!comments.empty()) {
    // TODO(teboring):  Ideally we should parse the comment text as Markdown and
    //   write it back as HTML, but this requires a Markdown parser.  For now
    //   we just use the proto comments unchanged.

    // If the comment itself contains block comment start or end markers,
    // HTML-escape them so that they don't accidentally close the doc comment.
    comments = EscapePhpdoc(comments);

    std::vector<string> lines = Split(comments, "\n", true);
    while (!lines.empty() && lines.back().empty()) {
      lines.pop_back();
    }

    for (int i = 0; i < lines.size(); i++) {
      // Most lines should start with a space.  Watch out for lines that start
      // with a /, since putting that right after the leading asterisk will
      // close the comment.
      if (indentCount == 0 && !lines[i].empty() && lines[i][0] == '/') {
        printer->Print(" * ^line^\n", "line", lines[i]);
      } else {
        std::string indent = std::string(indentCount, ' ');
        printer->Print(" *^ind^^line^\n", "ind", indent, "line", lines[i]);
      }
    }
    if (trailingNewline) {
      printer->Print(" *\n");
    }
  }
}